

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

void __thiscall CConfigManager::Reset(CConfigManager *this)

{
  char *in_RDI;
  char *in_stack_00000018;
  char *in_stack_00000020;
  char *in_stack_ffffffffffffffe8;
  
  in_RDI[0x134] = '\x01';
  in_RDI[0x135] = '\0';
  in_RDI[0x136] = '\0';
  in_RDI[0x137] = '\0';
  in_RDI[0x138] = '\0';
  in_RDI[0x139] = '\0';
  in_RDI[0x13a] = '\0';
  in_RDI[0x13b] = '\0';
  in_RDI[0x13c] = '\0';
  in_RDI[0x13d] = '\0';
  in_RDI[0x13e] = '\0';
  in_RDI[0x13f] = '\0';
  in_RDI[0x140] = '\x01';
  in_RDI[0x141] = '\0';
  in_RDI[0x142] = '\0';
  in_RDI[0x143] = '\0';
  in_RDI[0x144] = '\x01';
  in_RDI[0x145] = '\0';
  in_RDI[0x146] = '\0';
  in_RDI[0x147] = '\0';
  in_RDI[0x148] = '\x01';
  in_RDI[0x149] = '\0';
  in_RDI[0x14a] = '\0';
  in_RDI[0x14b] = '\0';
  in_RDI[0x14c] = '2';
  in_RDI[0x14d] = '\0';
  in_RDI[0x14e] = '\0';
  in_RDI[0x14f] = '\0';
  in_RDI[0x150] = '\0';
  in_RDI[0x151] = '\0';
  in_RDI[0x152] = '\0';
  in_RDI[0x153] = '\0';
  in_RDI[0x154] = '\x01';
  in_RDI[0x155] = '\0';
  in_RDI[0x156] = '\0';
  in_RDI[0x157] = '\0';
  in_RDI[0x158] = '\x01';
  in_RDI[0x159] = '\0';
  in_RDI[0x15a] = '\0';
  in_RDI[0x15b] = '\0';
  in_RDI[0x15c] = '\0';
  in_RDI[0x15d] = '\0';
  in_RDI[0x15e] = '\0';
  in_RDI[0x15f] = '\0';
  in_RDI[0x160] = '\0';
  in_RDI[0x161] = '\0';
  in_RDI[0x162] = '\0';
  in_RDI[0x163] = '\0';
  in_RDI[0x164] = '\x01';
  in_RDI[0x165] = '\0';
  in_RDI[0x166] = '\0';
  in_RDI[0x167] = '\0';
  in_RDI[0x168] = '\0';
  in_RDI[0x169] = '\0';
  in_RDI[0x16a] = '\0';
  in_RDI[0x16b] = '\0';
  in_RDI[0x16c] = '\x01';
  in_RDI[0x16d] = '\0';
  in_RDI[0x16e] = '\0';
  in_RDI[0x16f] = '\0';
  in_RDI[0x170] = '\x01';
  in_RDI[0x171] = '\0';
  in_RDI[0x172] = '\0';
  in_RDI[0x173] = '\0';
  in_RDI[0x174] = '\0';
  in_RDI[0x175] = '\0';
  in_RDI[0x176] = '\0';
  in_RDI[0x177] = '\0';
  in_RDI[0x178] = ',';
  in_RDI[0x179] = '\x01';
  in_RDI[0x17a] = '\0';
  in_RDI[0x17b] = '\0';
  in_RDI[0x17c] = '<';
  in_RDI[0x17d] = '\0';
  in_RDI[0x17e] = '\0';
  in_RDI[0x17f] = '\0';
  in_RDI[0x180] = -0x18;
  in_RDI[0x181] = '\x03';
  in_RDI[0x182] = '\0';
  in_RDI[0x183] = '\0';
  in_RDI[0x184] = -0x70;
  in_RDI[0x185] = '\x01';
  in_RDI[0x186] = '\0';
  in_RDI[0x187] = '\0';
  in_RDI[0x188] = '\0';
  in_RDI[0x189] = '\0';
  in_RDI[0x18a] = '\0';
  in_RDI[0x18b] = '\0';
  in_RDI[0x18c] = '\0';
  in_RDI[0x18d] = '\0';
  in_RDI[0x18e] = '\0';
  in_RDI[399] = '\0';
  in_RDI[400] = '\0';
  in_RDI[0x191] = '\0';
  in_RDI[0x192] = '\0';
  in_RDI[0x193] = '\0';
  in_RDI[0x194] = '\0';
  in_RDI[0x195] = '\0';
  in_RDI[0x196] = '\0';
  in_RDI[0x197] = '\0';
  in_RDI[0x198] = '\x01';
  in_RDI[0x199] = '\0';
  in_RDI[0x19a] = '\0';
  in_RDI[0x19b] = '\0';
  in_RDI[0x19c] = '\0';
  in_RDI[0x19d] = '\0';
  in_RDI[0x19e] = '\0';
  in_RDI[0x19f] = '\0';
  in_RDI[0x1a0] = '&';
  in_RDI[0x1a1] = -1;
  in_RDI[0x1a2] = -1;
  in_RDI[0x1a3] = -1;
  in_RDI[0x1a4] = 'L';
  in_RDI[0x1a5] = 'L';
  in_RDI[0x1a6] = 'L';
  in_RDI[0x1a7] = -1;
  in_RDI[0x1a8] = -1;
  in_RDI[0x1a9] = '\0';
  in_RDI[0x1aa] = '\0';
  in_RDI[0x1ab] = -1;
  in_RDI[0x1ac] = -1;
  in_RDI[0x1ad] = -1;
  in_RDI[0x1ae] = -1;
  in_RDI[0x1af] = -1;
  in_RDI[0x1b0] = -1;
  in_RDI[0x1b1] = -1;
  in_RDI[0x1b2] = -1;
  in_RDI[0x1b3] = -1;
  in_RDI[0x1b4] = -1;
  in_RDI[0x1b5] = '\0';
  in_RDI[0x1b6] = -1;
  in_RDI[0x1b7] = '\0';
  in_RDI[0x1b8] = -1;
  in_RDI[0x1b9] = -1;
  in_RDI[0x1ba] = -1;
  in_RDI[0x1bb] = -1;
  in_RDI[0x1bc] = -1;
  in_RDI[0x1bd] = -1;
  in_RDI[0x1be] = -1;
  in_RDI[0x1bf] = -1;
  in_RDI[0x1c0] = -1;
  in_RDI[0x1c1] = -1;
  in_RDI[0x1c2] = -1;
  in_RDI[0x1c3] = -1;
  in_RDI[0x1c4] = 'f';
  in_RDI[0x1c5] = -1;
  in_RDI[0x1c6] = -1;
  in_RDI[0x1c7] = -1;
  in_RDI[0x1c8] = '\x01';
  in_RDI[0x1c9] = '\0';
  in_RDI[0x1ca] = '\0';
  in_RDI[0x1cb] = '\0';
  in_RDI[0x1cc] = '\n';
  in_RDI[0x1cd] = '\0';
  in_RDI[0x1ce] = '\0';
  in_RDI[0x1cf] = '\0';
  in_RDI[0x1d0] = '\x01';
  in_RDI[0x1d1] = '\0';
  in_RDI[0x1d2] = '\0';
  in_RDI[0x1d3] = '\0';
  in_RDI[0x1d4] = '\x01';
  in_RDI[0x1d5] = '\0';
  in_RDI[0x1d6] = '\0';
  in_RDI[0x1d7] = '\0';
  str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  builtin_strncpy(in_RDI + 0x33c,"to\x1b",4);
  in_RDI[0x340] = -1;
  in_RDI[0x341] = '\0';
  in_RDI[0x342] = '\0';
  in_RDI[0x343] = -1;
  in_RDI[0x344] = 't';
  in_RDI[0x345] = 'o';
  in_RDI[0x346] = '\x1b';
  in_RDI[0x347] = '\0';
  in_RDI[0x348] = -0x62;
  in_RDI[0x349] = 'u';
  in_RDI[0x34a] = '\x1b';
  in_RDI[0x34b] = '\0';
  in_RDI[0x34c] = '>';
  in_RDI[0x34d] = -0x79;
  in_RDI[0x34e] = '\x1c';
  in_RDI[0x34f] = '\0';
  in_RDI[0x350] = -1;
  in_RDI[0x351] = '\0';
  in_RDI[0x352] = '\0';
  in_RDI[0x353] = '\0';
  in_RDI[0x354] = '\x01';
  in_RDI[0x355] = '\0';
  in_RDI[0x356] = '\0';
  in_RDI[0x357] = '\0';
  in_RDI[0x358] = '\x01';
  in_RDI[0x359] = '\0';
  in_RDI[0x35a] = '\0';
  in_RDI[0x35b] = '\0';
  in_RDI[0x35c] = '\x01';
  in_RDI[0x35d] = '\0';
  in_RDI[0x35e] = '\0';
  in_RDI[0x35f] = '\0';
  in_RDI[0x360] = '\x01';
  in_RDI[0x361] = '\0';
  in_RDI[0x362] = '\0';
  in_RDI[0x363] = '\0';
  in_RDI[0x364] = '\x01';
  in_RDI[0x365] = '\0';
  in_RDI[0x366] = '\0';
  in_RDI[0x367] = '\0';
  in_RDI[0x368] = '\x01';
  in_RDI[0x369] = '\0';
  in_RDI[0x36a] = '\0';
  in_RDI[0x36b] = '\0';
  str_utf8_copy_num(in_stack_00000020,in_stack_00000018,this._4_4_,(int)this);
  str_utf8_copy_num(in_stack_00000020,in_stack_00000018,this._4_4_,(int)this);
  str_utf8_copy_num(in_stack_00000020,in_stack_00000018,this._4_4_,(int)this);
  str_utf8_copy_num(in_stack_00000020,in_stack_00000018,this._4_4_,(int)this);
  str_utf8_copy_num(in_stack_00000020,in_stack_00000018,this._4_4_,(int)this);
  str_utf8_copy_num(in_stack_00000020,in_stack_00000018,this._4_4_,(int)this);
  str_utf8_copy_num(in_stack_00000020,in_stack_00000018,this._4_4_,(int)this);
  in_RDI[0x614] = '\x05';
  in_RDI[0x615] = '\0';
  in_RDI[0x616] = '\0';
  in_RDI[0x617] = '\0';
  in_RDI[0x618] = '\0';
  in_RDI[0x619] = '\0';
  in_RDI[0x61a] = '\0';
  in_RDI[0x61b] = '\0';
  str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  in_RDI[0x69c] = 'd';
  in_RDI[0x69d] = '\0';
  in_RDI[0x69e] = '\0';
  in_RDI[0x69f] = '\0';
  in_RDI[0x6a0] = 'd';
  in_RDI[0x6a1] = '\0';
  in_RDI[0x6a2] = '\0';
  in_RDI[0x6a3] = '\0';
  in_RDI[0x6a4] = '\x01';
  in_RDI[0x6a5] = '\0';
  in_RDI[0x6a6] = '\0';
  in_RDI[0x6a7] = '\0';
  in_RDI[0x6a8] = '\0';
  in_RDI[0x6a9] = '\0';
  in_RDI[0x6aa] = '\0';
  in_RDI[0x6ab] = '\0';
  in_RDI[0x6ac] = '\0';
  in_RDI[0x6ad] = '\0';
  in_RDI[0x6ae] = '\0';
  in_RDI[0x6af] = '\0';
  str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  in_RDI[0x6f0] = '\x01';
  in_RDI[0x6f1] = '\0';
  in_RDI[0x6f2] = '\0';
  in_RDI[0x6f3] = '\0';
  in_RDI[0x6f4] = '\x19';
  in_RDI[0x6f5] = '\0';
  in_RDI[0x6f6] = '\0';
  in_RDI[0x6f7] = '\0';
  in_RDI[0x6f8] = '\x1e';
  in_RDI[0x6f9] = '\0';
  in_RDI[0x6fa] = '\0';
  in_RDI[0x6fb] = '\0';
  in_RDI[0x6fc] = '(';
  in_RDI[0x6fd] = '\0';
  in_RDI[0x6fe] = '\0';
  in_RDI[0x6ff] = '\0';
  in_RDI[0x700] = '\x05';
  in_RDI[0x701] = '\0';
  in_RDI[0x702] = '\0';
  in_RDI[0x703] = '\0';
  in_RDI[0x704] = '\x01';
  in_RDI[0x705] = '\0';
  in_RDI[0x706] = '\0';
  in_RDI[0x707] = '\0';
  in_RDI[0x708] = '\0';
  in_RDI[0x709] = '\0';
  in_RDI[0x70a] = '\0';
  in_RDI[0x70b] = '\0';
  in_RDI[0x70c] = '\0';
  in_RDI[0x70d] = '\0';
  in_RDI[0x70e] = '\0';
  in_RDI[0x70f] = '\0';
  in_RDI[0x710] = -0x15;
  in_RDI[0x711] = '\x04';
  in_RDI[0x712] = '\0';
  in_RDI[0x713] = '\0';
  in_RDI[0x714] = '\0';
  in_RDI[0x715] = '\0';
  in_RDI[0x716] = '\0';
  in_RDI[0x717] = '\0';
  in_RDI[0x718] = '\x04';
  in_RDI[0x719] = '\a';
  in_RDI[0x71a] = '\0';
  in_RDI[0x71b] = '\0';
  in_RDI[0x71c] = '\0';
  in_RDI[0x71d] = '\0';
  in_RDI[0x71e] = '\0';
  in_RDI[0x71f] = '\0';
  in_RDI[0x720] = '\0';
  in_RDI[0x721] = '\0';
  in_RDI[0x722] = '\0';
  in_RDI[0x723] = '\0';
  str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  in_RDI[0xaa8] = '\0';
  in_RDI[0xaa9] = '\0';
  in_RDI[0xaaa] = '\0';
  in_RDI[0xaab] = '\0';
  str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  in_RDI[0xdac] = '\x01';
  in_RDI[0xdad] = '\0';
  in_RDI[0xdae] = '\0';
  in_RDI[0xdaf] = '\0';
  in_RDI[0xdb0] = '\x01';
  in_RDI[0xdb1] = '\0';
  in_RDI[0xdb2] = '\0';
  in_RDI[0xdb3] = '\0';
  in_RDI[0xdb4] = '\x01';
  in_RDI[0xdb5] = '\0';
  in_RDI[0xdb6] = '\0';
  in_RDI[0xdb7] = '\0';
  in_RDI[0xdb8] = '\x14';
  in_RDI[0xdb9] = '\0';
  in_RDI[0xdba] = '\0';
  in_RDI[0xdbb] = '\0';
  in_RDI[0xdbc] = '\0';
  in_RDI[0xdbd] = '\0';
  in_RDI[0xdbe] = '\0';
  in_RDI[0xdbf] = '\0';
  str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  in_RDI[0xde0] = '\0';
  in_RDI[0xde1] = '\0';
  in_RDI[0xde2] = '\0';
  in_RDI[0xde3] = '\0';
  in_RDI[0xde4] = '\0';
  in_RDI[0xde5] = '\0';
  in_RDI[0xde6] = '\0';
  in_RDI[0xde7] = '\0';
  in_RDI[0xde8] = '\x01';
  in_RDI[0xde9] = '\0';
  in_RDI[0xdea] = '\0';
  in_RDI[0xdeb] = '\0';
  in_RDI[0xdec] = '\x03';
  in_RDI[0xded] = '\0';
  in_RDI[0xdee] = '\0';
  in_RDI[0xdef] = '\0';
  in_RDI[0xdf0] = '\b';
  in_RDI[0xdf1] = '\0';
  in_RDI[0xdf2] = '\0';
  in_RDI[0xdf3] = '\0';
  in_RDI[0xdf4] = '\x01';
  in_RDI[0xdf5] = '\0';
  in_RDI[0xdf6] = '\0';
  in_RDI[0xdf7] = '\0';
  in_RDI[0xdf8] = '\x01';
  in_RDI[0xdf9] = '\0';
  in_RDI[0xdfa] = '\0';
  in_RDI[0xdfb] = '\0';
  in_RDI[0xdfc] = '\x03';
  in_RDI[0xdfd] = '\0';
  in_RDI[0xdfe] = '\0';
  in_RDI[0xdff] = '\0';
  in_RDI[0xe00] = '\x02';
  in_RDI[0xe01] = '\0';
  in_RDI[0xe02] = '\0';
  in_RDI[0xe03] = '\0';
  in_RDI[0xe04] = '\0';
  in_RDI[0xe05] = '\0';
  in_RDI[0xe06] = '\0';
  in_RDI[0xe07] = '\0';
  in_RDI[0xe08] = '\x01';
  in_RDI[0xe09] = '\0';
  in_RDI[0xe0a] = '\0';
  in_RDI[0xe0b] = '\0';
  in_RDI[0xe0c] = '\0';
  in_RDI[0xe0d] = '\0';
  in_RDI[0xe0e] = '\0';
  in_RDI[0xe0f] = '\0';
  in_RDI[0xe10] = '\x01';
  in_RDI[0xe11] = '\0';
  in_RDI[0xe12] = '\0';
  in_RDI[0xe13] = '\0';
  in_RDI[0xe14] = '\x03';
  in_RDI[0xe15] = '\0';
  in_RDI[0xe16] = '\0';
  in_RDI[0xe17] = '\0';
  in_RDI[0xe18] = '\x01';
  in_RDI[0xe19] = '\0';
  in_RDI[0xe1a] = '\0';
  in_RDI[0xe1b] = '\0';
  in_RDI[0xe1c] = '\0';
  in_RDI[0xe1d] = '\0';
  in_RDI[0xe1e] = '\0';
  in_RDI[0xe1f] = '\0';
  in_RDI[0xe20] = '\x05';
  in_RDI[0xe21] = '\0';
  in_RDI[0xe22] = '\0';
  in_RDI[0xe23] = '\0';
  in_RDI[0xe24] = '\0';
  in_RDI[0xe25] = '\0';
  in_RDI[0xe26] = '\0';
  in_RDI[0xe27] = '\0';
  in_RDI[0xe28] = '\0';
  in_RDI[0xe29] = '\0';
  in_RDI[0xe2a] = '\0';
  in_RDI[0xe2b] = '\0';
  str_utf8_copy_num(in_stack_00000020,in_stack_00000018,this._4_4_,(int)this);
  str_utf8_copy_num(in_stack_00000020,in_stack_00000018,this._4_4_,(int)this);
  in_RDI[0xea0] = -1;
  in_RDI[0xea1] = -1;
  in_RDI[0xea2] = -1;
  in_RDI[0xea3] = -1;
  str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  in_RDI[0xf44] = '\0';
  in_RDI[0xf45] = '\0';
  in_RDI[0xf46] = '\0';
  in_RDI[0xf47] = '\0';
  in_RDI[0xf48] = '\0';
  in_RDI[0xf49] = '\0';
  in_RDI[0xf4a] = '\0';
  in_RDI[0xf4b] = '\0';
  in_RDI[0xf4c] = '\x01';
  in_RDI[0xf4d] = '\0';
  in_RDI[0xf4e] = '\0';
  in_RDI[0xf4f] = '\0';
  in_RDI[0xf50] = '\0';
  in_RDI[0xf51] = '\0';
  in_RDI[0xf52] = '\0';
  in_RDI[0xf53] = '\0';
  in_RDI[0xf54] = '\0';
  in_RDI[0xf55] = '\0';
  in_RDI[0xf56] = '\0';
  in_RDI[0xf57] = '\0';
  in_RDI[0xf58] = '\x01';
  in_RDI[0xf59] = '\0';
  in_RDI[0xf5a] = '\0';
  in_RDI[0xf5b] = '\0';
  in_RDI[0xf5c] = '\0';
  in_RDI[0xf5d] = '\0';
  in_RDI[0xf5e] = '\0';
  in_RDI[0xf5f] = '\0';
  in_RDI[0xf60] = '\n';
  in_RDI[0xf61] = '\0';
  in_RDI[0xf62] = '\0';
  in_RDI[0xf63] = '\0';
  in_RDI[0xf64] = '\0';
  in_RDI[0xf65] = '\0';
  in_RDI[0xf66] = '\0';
  in_RDI[0xf67] = '\0';
  in_RDI[0xf68] = '\0';
  in_RDI[0xf69] = '\0';
  in_RDI[0xf6a] = '\0';
  in_RDI[0xf6b] = '\0';
  in_RDI[0xf6c] = '\n';
  in_RDI[0xf6d] = '\0';
  in_RDI[0xf6e] = '\0';
  in_RDI[0xf6f] = '\0';
  in_RDI[0xf70] = '\x01';
  in_RDI[0xf71] = '\0';
  in_RDI[0xf72] = '\0';
  in_RDI[0xf73] = '\0';
  in_RDI[0xf74] = '\x01';
  in_RDI[0xf75] = '\0';
  in_RDI[0xf76] = '\0';
  in_RDI[0xf77] = '\0';
  in_RDI[0xf78] = '\x01';
  in_RDI[0xf79] = '\0';
  in_RDI[0xf7a] = '\0';
  in_RDI[0xf7b] = '\0';
  str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  in_RDI[0xf98] = '\x04';
  in_RDI[0xf99] = '\0';
  in_RDI[0xf9a] = '\0';
  in_RDI[0xf9b] = '\0';
  in_RDI[0xf9c] = '\x01';
  in_RDI[0xf9d] = '\0';
  in_RDI[0xf9e] = '\0';
  in_RDI[3999] = '\0';
  in_RDI[4000] = '\x19';
  in_RDI[0xfa1] = '\0';
  in_RDI[0xfa2] = '\0';
  in_RDI[0xfa3] = '\0';
  in_RDI[0xfa4] = '\0';
  in_RDI[0xfa5] = '\0';
  in_RDI[0xfa6] = '\0';
  in_RDI[0xfa7] = '\0';
  in_RDI[0xfa8] = '\0';
  in_RDI[0xfa9] = '\0';
  in_RDI[0xfaa] = '\0';
  in_RDI[0xfab] = '\0';
  in_RDI[0xfac] = '\0';
  in_RDI[0xfad] = '\x02';
  in_RDI[0xfae] = '\0';
  in_RDI[0xfaf] = '\0';
  in_RDI[0xfb0] = -0x80;
  in_RDI[0xfb1] = -0x45;
  in_RDI[0xfb2] = '\0';
  in_RDI[0xfb3] = '\0';
  in_RDI[0xfb4] = '\x01';
  in_RDI[0xfb5] = '\0';
  in_RDI[0xfb6] = '\0';
  in_RDI[0xfb7] = '\0';
  in_RDI[0xfb8] = '\x01';
  in_RDI[0xfb9] = '\0';
  in_RDI[0xfba] = '\0';
  in_RDI[0xfbb] = '\0';
  in_RDI[0xfbc] = '\x01';
  in_RDI[0xfbd] = '\0';
  in_RDI[0xfbe] = '\0';
  in_RDI[0xfbf] = '\0';
  in_RDI[0xfc0] = 'd';
  in_RDI[0xfc1] = '\0';
  in_RDI[0xfc2] = '\0';
  in_RDI[0xfc3] = '\0';
  in_RDI[0xfc4] = '\0';
  in_RDI[0xfc5] = '\0';
  in_RDI[0xfc6] = '\0';
  in_RDI[0xfc7] = '\0';
  in_RDI[0xfc8] = '\x01';
  in_RDI[0xfc9] = '\0';
  in_RDI[0xfca] = '\0';
  in_RDI[0xfcb] = '\0';
  in_RDI[0xfcc] = '\0';
  in_RDI[0xfcd] = '\0';
  in_RDI[0xfce] = '\0';
  in_RDI[0xfcf] = '\0';
  in_RDI[0xfd0] = '\0';
  in_RDI[0xfd1] = '\0';
  in_RDI[0xfd2] = '\0';
  in_RDI[0xfd3] = '\0';
  in_RDI[0xfd4] = '\0';
  in_RDI[0xfd5] = '\0';
  in_RDI[0xfd6] = '\0';
  in_RDI[0xfd7] = '\0';
  in_RDI[0xfd8] = '\0';
  in_RDI[0xfd9] = '\0';
  in_RDI[0xfda] = '\0';
  in_RDI[0xfdb] = '\0';
  in_RDI[0xfdc] = '\x01';
  in_RDI[0xfdd] = '\0';
  in_RDI[0xfde] = '\0';
  in_RDI[0xfdf] = '\0';
  in_RDI[0xfe0] = '\0';
  in_RDI[0xfe1] = '\0';
  in_RDI[0xfe2] = '\0';
  in_RDI[0xfe3] = '\0';
  in_RDI[0xfe4] = '\x01';
  in_RDI[0xfe5] = '\0';
  in_RDI[0xfe6] = '\0';
  in_RDI[0xfe7] = '\0';
  in_RDI[0xfe8] = '\0';
  in_RDI[0xfe9] = '\0';
  in_RDI[0xfea] = '\0';
  in_RDI[0xfeb] = '\0';
  in_RDI[0xfec] = '\x01';
  in_RDI[0xfed] = '\0';
  in_RDI[0xfee] = '\0';
  in_RDI[0xfef] = '\0';
  in_RDI[0xff0] = '\0';
  in_RDI[0xff1] = '\0';
  in_RDI[0xff2] = '\0';
  in_RDI[0xff3] = '\0';
  in_RDI[0xff4] = '\x01';
  in_RDI[0xff5] = '\0';
  in_RDI[0xff6] = '\0';
  in_RDI[0xff7] = '\0';
  in_RDI[0xff8] = '\x01';
  in_RDI[0xff9] = '\0';
  in_RDI[0xffa] = '\0';
  in_RDI[0xffb] = '\0';
  in_RDI[0xffc] = '\0';
  in_RDI[0xffd] = '\0';
  in_RDI[0xffe] = '\0';
  in_RDI[0xfff] = '\0';
  in_RDI[0x1000] = '\x01';
  in_RDI[0x1001] = '\0';
  in_RDI[0x1002] = '\0';
  in_RDI[0x1003] = '\0';
  in_RDI[0x1004] = '\0';
  in_RDI[0x1005] = '\0';
  in_RDI[0x1006] = '\0';
  in_RDI[0x1007] = '\0';
  in_RDI[0x1008] = -0x70;
  in_RDI[0x1009] = '\0';
  in_RDI[0x100a] = '\0';
  in_RDI[0x100b] = '\0';
  in_RDI[0x100c] = '\0';
  in_RDI[0x100d] = '\0';
  in_RDI[0x100e] = '\0';
  in_RDI[0x100f] = '\0';
  in_RDI[0x1010] = '\x01';
  in_RDI[0x1011] = '\0';
  in_RDI[0x1012] = '\0';
  in_RDI[0x1013] = '\0';
  in_RDI[0x1014] = '\0';
  in_RDI[0x1015] = '\0';
  in_RDI[0x1016] = '\0';
  in_RDI[0x1017] = '\0';
  in_RDI[0x1018] = 'd';
  in_RDI[0x1019] = '\0';
  in_RDI[0x101a] = '\0';
  in_RDI[0x101b] = '\0';
  in_RDI[0x101c] = '\0';
  in_RDI[0x101d] = '\0';
  in_RDI[0x101e] = '\0';
  in_RDI[0x101f] = '\0';
  str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  in_RDI[0x1044] = '\0';
  in_RDI[0x1045] = '\0';
  in_RDI[0x1046] = '\0';
  in_RDI[0x1047] = '\0';
  in_RDI[0x1048] = 'd';
  in_RDI[0x1049] = '\0';
  in_RDI[0x104a] = '\0';
  in_RDI[0x104b] = '\0';
  in_RDI[0x104c] = '\0';
  in_RDI[0x104d] = '\0';
  in_RDI[0x104e] = '\0';
  in_RDI[0x104f] = '\0';
  in_RDI[0x1050] = '\x01';
  in_RDI[0x1051] = '\0';
  in_RDI[0x1052] = '\0';
  in_RDI[0x1053] = '\0';
  in_RDI[0x1054] = '\x05';
  in_RDI[0x1055] = '\0';
  in_RDI[0x1056] = '\0';
  in_RDI[0x1057] = '\0';
  str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  in_RDI[0x11d8] = 'o';
  in_RDI[0x11d9] = ' ';
  in_RDI[0x11da] = '\0';
  in_RDI[0x11db] = '\0';
  in_RDI[0x11dc] = '\0';
  in_RDI[0x11dd] = '\0';
  in_RDI[0x11de] = '\0';
  in_RDI[0x11df] = '\0';
  str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  in_RDI[0x1260] = '\b';
  in_RDI[0x1261] = '\0';
  in_RDI[0x1262] = '\0';
  in_RDI[0x1263] = '\0';
  in_RDI[0x1264] = '\x04';
  in_RDI[0x1265] = '\0';
  in_RDI[0x1266] = '\0';
  in_RDI[0x1267] = '\0';
  in_RDI[0x1268] = '\b';
  in_RDI[0x1269] = '\0';
  in_RDI[0x126a] = '\0';
  in_RDI[0x126b] = '\0';
  in_RDI[0x126c] = '\0';
  in_RDI[0x126d] = '\0';
  in_RDI[0x126e] = '\0';
  in_RDI[0x126f] = '\0';
  in_RDI[0x1270] = '\x01';
  in_RDI[0x1271] = '\0';
  in_RDI[0x1272] = '\0';
  in_RDI[0x1273] = '\0';
  str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  in_RDI[0x12b4] = '\x03';
  in_RDI[0x12b5] = '\0';
  in_RDI[0x12b6] = '\0';
  in_RDI[0x12b7] = '\0';
  in_RDI[0x12b8] = '\x05';
  in_RDI[0x12b9] = '\0';
  in_RDI[0x12ba] = '\0';
  in_RDI[0x12bb] = '\0';
  in_RDI[0x12bc] = '\0';
  in_RDI[0x12bd] = '\0';
  in_RDI[0x12be] = '\0';
  in_RDI[0x12bf] = '\0';
  in_RDI[0x12c0] = '\n';
  in_RDI[0x12c1] = '\0';
  in_RDI[0x12c2] = '\0';
  in_RDI[0x12c3] = '\0';
  str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  in_RDI[0x1364] = '\0';
  in_RDI[0x1365] = '\0';
  in_RDI[0x1366] = '\0';
  in_RDI[0x1367] = '\0';
  str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  in_RDI[5000] = '\0';
  in_RDI[0x1389] = '\0';
  in_RDI[0x138a] = '\0';
  in_RDI[0x138b] = '\0';
  in_RDI[0x138c] = '\x1e';
  in_RDI[0x138d] = '\0';
  in_RDI[0x138e] = '\0';
  in_RDI[0x138f] = '\0';
  in_RDI[0x1390] = '\x01';
  in_RDI[0x1391] = '\0';
  in_RDI[0x1392] = '\0';
  in_RDI[0x1393] = '\0';
  in_RDI[0x1394] = '\0';
  in_RDI[0x1395] = '\0';
  in_RDI[0x1396] = '\0';
  in_RDI[0x1397] = '\0';
  in_RDI[0x1398] = '\0';
  in_RDI[0x1399] = '\0';
  in_RDI[0x139a] = '\0';
  in_RDI[0x139b] = '\0';
  in_RDI[0x139c] = '\0';
  in_RDI[0x139d] = '\0';
  in_RDI[0x139e] = '\0';
  in_RDI[0x139f] = '\0';
  in_RDI[0x13a0] = '\0';
  in_RDI[0x13a1] = '\0';
  in_RDI[0x13a2] = '\0';
  in_RDI[0x13a3] = '\0';
  in_RDI[0x13a4] = '\0';
  in_RDI[0x13a5] = '\0';
  in_RDI[0x13a6] = '\0';
  in_RDI[0x13a7] = '\0';
  in_RDI[0x13a8] = '\0';
  in_RDI[0x13a9] = '\0';
  in_RDI[0x13aa] = '\0';
  in_RDI[0x13ab] = '\0';
  in_RDI[0x13ac] = '\0';
  in_RDI[0x13ad] = '\0';
  in_RDI[0x13ae] = '\0';
  in_RDI[0x13af] = '\0';
  str_copy(in_RDI,in_stack_ffffffffffffffe8,0);
  in_RDI[0x13d0] = '\0';
  in_RDI[0x13d1] = '\0';
  in_RDI[0x13d2] = '\0';
  in_RDI[0x13d3] = '\0';
  return;
}

Assistant:

void CConfigManager::Reset()
{
	#define MACRO_CONFIG_INT(Name,ScriptName,def,min,max,flags,desc) m_Values.m_##Name = def;
	#define MACRO_CONFIG_STR(Name,ScriptName,len,def,flags,desc) str_copy(m_Values.m_##Name, def, len);
	#define MACRO_CONFIG_UTF8STR(Name,ScriptName,size,len,def,flags,desc) str_utf8_copy_num(m_Values.m_##Name, def, size, len);

	#include "config_variables.h"

	#undef MACRO_CONFIG_INT
	#undef MACRO_CONFIG_STR
	#undef MACRO_CONFIG_UTF8STR
}